

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neuron.cpp
# Opt level: O0

void __thiscall indk::Neuron::setLearned(Neuron *this,bool LearnedFlag)

{
  bool bVar1;
  reference ppRVar2;
  Receptor *R_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<indk::Neuron::Receptor_*,_std::allocator<indk::Neuron::Receptor_*>_> *__range2_1;
  Receptor *R;
  iterator __end2;
  iterator __begin2;
  vector<indk::Neuron::Receptor_*,_std::allocator<indk::Neuron::Receptor_*>_> *__range2;
  bool LearnedFlag_local;
  Neuron *this_local;
  
  this->Learned = LearnedFlag;
  if ((this->Learned & 1U) == 0) {
    __end2_1 = std::vector<indk::Neuron::Receptor_*,_std::allocator<indk::Neuron::Receptor_*>_>::
               begin(&this->Receptors);
    R_1 = (Receptor *)
          std::vector<indk::Neuron::Receptor_*,_std::allocator<indk::Neuron::Receptor_*>_>::end
                    (&this->Receptors);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<indk::Neuron::Receptor_**,_std::vector<indk::Neuron::Receptor_*,_std::allocator<indk::Neuron::Receptor_*>_>_>
                               *)&R_1), bVar1) {
      ppRVar2 = __gnu_cxx::
                __normal_iterator<indk::Neuron::Receptor_**,_std::vector<indk::Neuron::Receptor_*,_std::allocator<indk::Neuron::Receptor_*>_>_>
                ::operator*(&__end2_1);
      Receptor::doUnlock(*ppRVar2);
      __gnu_cxx::
      __normal_iterator<indk::Neuron::Receptor_**,_std::vector<indk::Neuron::Receptor_*,_std::allocator<indk::Neuron::Receptor_*>_>_>
      ::operator++(&__end2_1);
    }
  }
  else {
    __end2 = std::vector<indk::Neuron::Receptor_*,_std::allocator<indk::Neuron::Receptor_*>_>::begin
                       (&this->Receptors);
    R = (Receptor *)
        std::vector<indk::Neuron::Receptor_*,_std::allocator<indk::Neuron::Receptor_*>_>::end
                  (&this->Receptors);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<indk::Neuron::Receptor_**,_std::vector<indk::Neuron::Receptor_*,_std::allocator<indk::Neuron::Receptor_*>_>_>
                                       *)&R), bVar1) {
      ppRVar2 = __gnu_cxx::
                __normal_iterator<indk::Neuron::Receptor_**,_std::vector<indk::Neuron::Receptor_*,_std::allocator<indk::Neuron::Receptor_*>_>_>
                ::operator*(&__end2);
      Receptor::doLock(*ppRVar2);
      __gnu_cxx::
      __normal_iterator<indk::Neuron::Receptor_**,_std::vector<indk::Neuron::Receptor_*,_std::allocator<indk::Neuron::Receptor_*>_>_>
      ::operator++(&__end2);
    }
  }
  return;
}

Assistant:

void indk::Neuron::setLearned(bool LearnedFlag) {
    Learned = LearnedFlag;

    if (Learned)
        for (auto R: Receptors) R -> doLock();
    else
        for (auto R: Receptors) R -> doUnlock();
}